

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_flattener.h
# Opt level: O0

void __thiscall
mp::
ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::ConvertModel(ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
               *this)

{
  FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *__f;
  ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_RDI;
  SuffixGetterSetter *in_stack_ffffffffffffff28;
  function<void_(const_mp::SuffixDef<double>_&,_mp::ArrayRef<double>)> *this_00;
  ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *this_01;
  function<void_(const_mp::SuffixDef<double>_&,_mp::ArrayRef<double>)> local_88 [4];
  
  __f = GetFlatCvt(in_RDI);
  this_00 = local_88;
  this_01 = in_RDI;
  std::function<mp::ArrayRef<int>(mp::SuffixDef<int>const&)>::
  function<mp::ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>::ConvertModel()::_lambda(mp::SuffixDef<int>const&)_1_,void>
            ((function<mp::ArrayRef<int>_(const_mp::SuffixDef<int>_&)> *)this_00,
             (anon_class_8_1_8991fb9c *)__f);
  std::function<mp::ArrayRef<double>(mp::SuffixDef<double>const&)>::
  function<mp::ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>::ConvertModel()::_lambda(mp::SuffixDef<double>const&)_1_,void>
            ((function<mp::ArrayRef<double>_(const_mp::SuffixDef<double>_&)> *)this_00,
             (anon_class_8_1_8991fb9c *)__f);
  std::function<void(mp::SuffixDef<int>const&,mp::ArrayRef<int>)>::
  function<mp::ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>::ConvertModel()::_lambda(mp::SuffixDef<int>const&,mp::ArrayRef<int>)_1_,void>
            ((function<void_(const_mp::SuffixDef<int>_&,_mp::ArrayRef<int>)> *)this_00,
             (anon_class_8_1_8991fb9c *)__f);
  std::function<void(mp::SuffixDef<double>const&,mp::ArrayRef<double>)>::
  function<mp::ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>::ConvertModel()::_lambda(mp::SuffixDef<double>const&,mp::ArrayRef<double>)_1_,void>
            (this_00,(anon_class_8_1_8991fb9c *)__f);
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ::SetSuffixManip((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                    *)in_RDI,in_stack_ffffffffffffff28);
  SuffixGetterSetter::~SuffixGetterSetter((SuffixGetterSetter *)in_RDI);
  GetFlatCvt(in_RDI);
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ::StartModelInput((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                     *)0x1352c5);
  ConvertStandardItems(this_01);
  GetFlatCvt(in_RDI);
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ::FinishModelInput((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                      *)in_RDI);
  return;
}

Assistant:

void ConvertModel() override {
    GetFlatCvt().SetSuffixManip( {
        [this](const SuffixDef<int>& sd)
                                 { return GetModel().ReadIntSuffix(sd); },
        [this](const SuffixDef<double>& sd)
                                 { return GetModel().ReadDblSuffix(sd); },
        [this](const SuffixDef<int>& sd, ArrayRef<int> data)
                                 { GetModel().ReportSuffix(sd, data); },
        [this](const SuffixDef<double>& sd, ArrayRef<double> data)
                                 { GetModel().ReportSuffix(sd, data); }
    } );
    GetFlatCvt().StartModelInput();
    MP_DISPATCH( ConvertStandardItems() );
    GetFlatCvt().FinishModelInput();      // Chance to flush to the Backend
  }